

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O0

string * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::getParentLink_abi_cxx11_
          (ThreeAxisAngularAccelerometerSensor *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(*(long *)(in_RSI + 8) + 0x88));
  return in_RDI;
}

Assistant:

std::string ThreeAxisAngularAccelerometerSensor::getParentLink() const
{
    return(this->pimpl->parent_link_name);
}